

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_free_hash_table.h
# Opt level: O1

void __thiscall
neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::
LockFreeHashTable(LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>
                  *this,size_t expectedThreadCount,size_t expectedDataNum)

{
  undefined8 *puVar1;
  pointer pNVar2;
  long lVar3;
  ulong uVar4;
  DataNode *pDVar5;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  DataNode *pDVar8;
  allocator_type local_41;
  pointer local_40;
  size_t local_38;
  
  std::
  vector<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>
  ::vector(&this->data_pool_,expectedThreadCount + 2,&local_41);
  (this->epoch_).inner_epoch_.table_ = (Entry *)0x0;
  (this->epoch_).inner_epoch_.num_entries_ = 0;
  lVar3 = 0x30;
  do {
    *(undefined8 *)((long)((this->epoch_).inner_epoch_.drain_list_ + -2) + lVar3) =
         0xffffffffffffffff;
    puVar1 = (undefined8 *)((long)(this->epoch_).inner_epoch_.drain_list_ + lVar3 + -0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x1830);
  (this->epoch_).inner_epoch_.drain_count_.super___atomic_base<unsigned_int>._M_i = 0;
  FASTER::core::LightEpoch::Initialize(&(this->epoch_).inner_epoch_,(uint32_t)expectedThreadCount);
  lVar3 = 0x1840;
  do {
    LOCK();
    *(undefined8 *)((long)(this->epoch_).inner_epoch_.drain_list_ + lVar3 + -0x28) = 0;
    UNLOCK();
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x2040);
  this->maxLevel_ = 0x14;
  this->maxElement_ = 0;
  uVar4 = expectedDataNum / expectedThreadCount;
  local_40 = (this->data_pool_).
             super__Vector_base<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>,_std::allocator<NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = 0;
  local_38 = expectedThreadCount;
  do {
    if (expectedThreadCount <= expectedDataNum) {
      pNVar2 = local_40 + uVar7;
      uVar6 = 0;
      pDVar8 = local_40[uVar7].head_;
      do {
        pDVar5 = (DataNode *)malloc(0x38);
        pDVar5->next = pDVar8;
        pDVar5->last = (DataNode *)0x0;
        if (pDVar8 == (DataNode *)0x0) {
          pNVar2->tail_ = pDVar5;
          pDVar5->next = (DataNode *)0x0;
        }
        else {
          pDVar8->last = pDVar5;
        }
        uVar6 = uVar6 + 1;
        pDVar8 = pDVar5;
      } while (uVar6 < uVar4);
      pNVar2->head_ = pDVar5;
      expectedThreadCount = local_38;
    }
    uVar7 = (ulong)((int)uVar7 + 1);
  } while (uVar7 < expectedThreadCount);
  return;
}

Assistant:

explicit LockFreeHashTable(size_t expectedThreadCount, size_t expectedDataNum = 1000000) :
            epoch_(expectedThreadCount),
            data_pool_(expectedThreadCount + 2) {
        for (std::atomic<Node *> &ptr : root_)
            ptr.store(nullptr);
        size_t m = 1, num = kArraySize, level = 1;
        size_t total_bit = sizeof(Key) * 8;
        if (total_bit <= 64) {
            for (size_t i = 0; i < total_bit; i++)
                m *= 2;
            for (; num < m; num += num * kArraySize)
                level++;
            level++;
        }
        maxLevel_ = 20;
        maxElement_ = m;

        size_t each = expectedDataNum / expectedThreadCount;
        for (uint32_t i = 0; i < expectedThreadCount; i++) {
            for (size_t j = 0; j < each; j++) {
                data_pool_[i].Push((DataNode *) malloc(sizeof(DataNode)));
            }
        }
    }